

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O2

void fill_pointers(pixels *p,exr_coding_channel_info_t *curchan,int32_t idxoffset,void **ptr,
                  int32_t *pixelstride,int32_t *linestride)

{
  char *pcVar1;
  int32_t iVar2;
  sbyte sVar3;
  ostream *poVar4;
  pointer pfVar5;
  
  pcVar1 = curchan->channel_name;
  switch(*pcVar1) {
  case 'A':
    if (pcVar1[1] != '\0') goto switchD_00110cb0_caseD_43;
    pfVar5 = (pointer)(p->rgba[3].
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start + idxoffset);
    break;
  case 'B':
    if (pcVar1[1] != '\0') goto switchD_00110cb0_caseD_43;
    pfVar5 = (pointer)(p->rgba[2].
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start + idxoffset);
    break;
  case 'C':
  case 'D':
  case 'E':
switchD_00110cb0_caseD_43:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Unknown channel name \'");
    poVar4 = std::operator<<(poVar4,curchan->channel_name);
    poVar4 = std::operator<<(poVar4,"\'");
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("false",(char *)0x2ed,0x156492,(char *)ptr);
  case 'F':
    if (pcVar1[1] != '\0') goto switchD_00110cb0_caseD_43;
    pfVar5 = (p->f).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start + idxoffset;
    goto LAB_00110d39;
  case 'G':
    if (pcVar1[1] != '\0') goto switchD_00110cb0_caseD_43;
    pfVar5 = (pointer)(p->rgba[1].
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start + idxoffset);
    break;
  case 'H':
    if (pcVar1[1] != '\0') goto switchD_00110cb0_caseD_43;
    pfVar5 = (pointer)((p->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                       _M_impl.super__Vector_impl_data._M_start + idxoffset);
    break;
  case 'I':
    if (pcVar1[1] != '\0') goto switchD_00110cb0_caseD_43;
    pfVar5 = (pointer)((p->i).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start + idxoffset);
LAB_00110d39:
    sVar3 = 2;
    iVar2 = 4;
    goto LAB_00110d55;
  default:
    if ((*pcVar1 != 'R') || (pcVar1[1] != '\0')) goto switchD_00110cb0_caseD_43;
    pfVar5 = (pointer)(p->rgba[0].
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start + idxoffset);
  }
  sVar3 = 1;
  iVar2 = 2;
LAB_00110d55:
  *ptr = pfVar5;
  *pixelstride = iVar2;
  *linestride = p->_stride_x << sVar3;
  return;
}

Assistant:

static void
fill_pointers (
    pixels&                          p,
    const exr_coding_channel_info_t& curchan,
    int32_t                          idxoffset,
    void**                           ptr,
    int32_t*                         pixelstride,
    int32_t*                         linestride)
{
    if (!strcmp (curchan.channel_name, "A"))
    {
        *ptr         = p.rgba[3].data () + idxoffset;
        *pixelstride = 2;
        *linestride  = 2 * p._stride_x;
    }
    else if (!strcmp (curchan.channel_name, "B"))
    {
        *ptr         = p.rgba[2].data () + idxoffset;
        *pixelstride = 2;
        *linestride  = 2 * p._stride_x;
    }
    else if (!strcmp (curchan.channel_name, "G"))
    {
        *ptr         = p.rgba[1].data () + idxoffset;
        *pixelstride = 2;
        *linestride  = 2 * p._stride_x;
    }
    else if (!strcmp (curchan.channel_name, "R"))
    {
        *ptr         = p.rgba[0].data () + idxoffset;
        *pixelstride = 2;
        *linestride  = 2 * p._stride_x;
    }
    else if (!strcmp (curchan.channel_name, "H"))
    {
        *ptr         = p.h.data () + idxoffset;
        *pixelstride = 2;
        *linestride  = 2 * p._stride_x;
    }
    else if (!strcmp (curchan.channel_name, "F"))
    {
        *ptr         = p.f.data () + idxoffset;
        *pixelstride = 4;
        *linestride  = 4 * p._stride_x;
    }
    else if (!strcmp (curchan.channel_name, "I"))
    {
        *ptr         = p.i.data () + idxoffset;
        *pixelstride = 4;
        *linestride  = 4 * p._stride_x;
    }
    else
    {
        std::cerr << "Unknown channel name '" << curchan.channel_name << "'"
                  << std::endl;
        EXRCORE_TEST (false);
        *ptr         = nullptr;
        *pixelstride = -1;
        *linestride  = -1;
    }
}